

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_dynlight.cpp
# Opt level: O0

void Handler_type_S_DynamicLight
               (ADynamicLight *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  char *in;
  int iVar1;
  int style;
  char *str;
  FPropParam *params_local;
  Baggage *bag_local;
  PClassActor *info_local;
  ADynamicLight *defaults_local;
  
  in = params[1].s;
  iVar1 = MatchString(in,Handler_type_S_DynamicLight::ltype_names);
  if (iVar1 < 0) {
    I_Error("Unknown light type \'%s\'",in);
  }
  defaults->lighttype = (BYTE)Handler_type_S_DynamicLight::ltype_values[iVar1];
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY(type, S, DynamicLight)
{
	PROP_STRING_PARM(str, 0);
	static const char * ltype_names[]={
		"Point","Pulse","Flicker","Sector","RandomFlicker", "ColorPulse", "ColorFlicker", "RandomColorFlicker", NULL};

	static const int ltype_values[]={
		PointLight, PulseLight, FlickerLight, SectorLight, RandomFlickerLight, ColorPulseLight, ColorFlickerLight, RandomColorFlickerLight };

	int style = MatchString(str, ltype_names);
	if (style < 0) I_Error("Unknown light type '%s'", str);
	defaults->lighttype = ltype_values[style];
}